

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialTransaction::SetFromHex(ConfidentialTransaction *this,string *hex_string)

{
  uchar *__first;
  uint32_t index;
  uint32_t sequence;
  void *pvVar1;
  uchar *puVar2;
  long *plVar3;
  CfdException *this_00;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long local_438;
  wally_tx *tx_pointer;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> blinding_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txid_buf;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> vout_work;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> vin_work;
  ScriptWitness local_398;
  vector<unsigned_char,_std::allocator<unsigned_char>_> entropy;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witness_buf;
  ScriptWitness local_320;
  ConfidentialNonce local_300;
  ConfidentialValue local_2d8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_2b0;
  Script unlocking_script;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_260;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_248;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_230;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_218;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_200;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  ConfidentialTxIn txin;
  ScriptWitness local_70;
  ScriptWitness local_50;
  
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  vin_work.
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vin_work.
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vin_work.
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vout_work.
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vout_work.
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vout_work.
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ret = wally_tx_from_hex((hex_string->_M_dataplus)._M_p,2);
  if (ret == 0) {
    (this->super_AbstractTransaction).wally_tx_pointer_ = (void *)0x0;
    uVar7 = 0;
    ret = 0;
    while( true ) {
      if (uRam0000000000000010 <= uVar7) break;
      __first = (uchar *)(lRam0000000000000008 + uVar7 * 0xd0);
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&txid_buf,__first,
                 (uchar *)(lRam0000000000000008 + uVar7 * 0xd0 + 0x20),(allocator_type *)&txin);
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&script_buf,
                 *(uchar **)(__first + 0x28),*(uchar **)(__first + 0x28) + *(long *)(__first + 0x30)
                 ,(allocator_type *)&txin);
      ByteData::ByteData((ByteData *)&txin,&script_buf);
      Script::Script(&unlocking_script,(ByteData *)&txin);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txin);
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&blinding_buf,__first + 0x41
                 ,__first + 0x61,(allocator_type *)&txin);
      ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&entropy,__first + 0x61,
                 __first + 0x81,(allocator_type *)&txin);
      ByteData256::ByteData256((ByteData256 *)&local_1e8,&txid_buf);
      Txid::Txid((Txid *)&local_300,(ByteData256 *)&local_1e8);
      index = *(uint32_t *)(__first + 0x20);
      sequence = *(uint32_t *)(__first + 0x24);
      local_398._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00276ca8;
      local_398.witness_stack_.
      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_398.witness_stack_.
      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_398.witness_stack_.
      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ByteData256::ByteData256((ByteData256 *)&local_200,&blinding_buf);
      ByteData256::ByteData256((ByteData256 *)&local_218,&entropy);
      ConvertToByteData((ByteData *)&local_230,*(uint8_t **)(__first + 0x88),
                        *(size_t *)(__first + 0x90));
      ConfidentialValue::ConfidentialValue((ConfidentialValue *)&witness_buf,(ByteData *)&local_230)
      ;
      ConvertToByteData((ByteData *)&local_248,*(uint8_t **)(__first + 0x98),
                        *(size_t *)(__first + 0xa0));
      ConfidentialValue::ConfidentialValue(&local_2d8,(ByteData *)&local_248);
      ConvertToByteData((ByteData *)&local_260,*(uint8_t **)(__first + 0xa8),
                        *(size_t *)(__first + 0xb0));
      ConvertToByteData((ByteData *)&local_2b0,*(uint8_t **)(__first + 0xb8),
                        *(size_t *)(__first + 0xc0));
      local_320._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00276ca8;
      local_320.witness_stack_.
      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_320.witness_stack_.
      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_320.witness_stack_.
      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ConfidentialTxIn::ConfidentialTxIn
                (&txin,(Txid *)&local_300,index,sequence,&unlocking_script,&local_398,
                 (ByteData256 *)&local_200,(ByteData256 *)&local_218,
                 (ConfidentialValue *)&witness_buf,&local_2d8,(ByteData *)&local_260,
                 (ByteData *)&local_2b0,&local_320);
      ScriptWitness::~ScriptWitness(&local_320);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_2b0);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_260);
      ConfidentialValue::~ConfidentialValue(&local_2d8);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_248);
      ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&witness_buf);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_230);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_218);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_200);
      ScriptWitness::~ScriptWitness(&local_398);
      Txid::~Txid((Txid *)&local_300);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1e8);
      plVar3 = *(long **)(__first + 0x38);
      if ((plVar3 != (long *)0x0) && (uVar4 = plVar3[1], uVar4 != 0)) {
        lVar6 = 8;
        for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
          puVar2 = *(uchar **)(*plVar3 + -8 + lVar6);
          ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&witness_buf,puVar2,
                     puVar2 + *(long *)(*plVar3 + lVar6),(allocator_type *)&local_2d8);
          ByteData::ByteData((ByteData *)&local_2d8,&witness_buf);
          AbstractTxIn::AddScriptWitnessStack
                    (&local_50,&txin.super_AbstractTxIn,(ByteData *)&local_2d8);
          ScriptWitness::~ScriptWitness(&local_50);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2d8);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&witness_buf);
          plVar3 = *(long **)(__first + 0x38);
          uVar4 = plVar3[1];
          lVar6 = lVar6 + 0x10;
        }
      }
      plVar3 = *(long **)(__first + 200);
      if ((plVar3 != (long *)0x0) && (uVar4 = plVar3[1], uVar4 != 0)) {
        lVar6 = 8;
        for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
          puVar2 = *(uchar **)(*plVar3 + -8 + lVar6);
          ::std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&witness_buf,puVar2,
                     puVar2 + *(long *)(*plVar3 + lVar6),(allocator_type *)&local_2d8);
          ByteData::ByteData((ByteData *)&local_2d8,&witness_buf);
          ConfidentialTxIn::AddPeginWitnessStack(&local_70,&txin,(ByteData *)&local_2d8);
          ScriptWitness::~ScriptWitness(&local_70);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2d8);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&witness_buf);
          plVar3 = *(long **)(__first + 200);
          uVar4 = plVar3[1];
          lVar6 = lVar6 + 0x10;
        }
      }
      ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
      push_back(&vin_work,&txin);
      ConfidentialTxIn::~ConfidentialTxIn(&txin);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&blinding_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      Script::~Script(&unlocking_script);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&script_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      uVar7 = uVar7 + 1;
    }
    txin.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)0x231217;
    txin.super_AbstractTxIn.txid_._vptr_Txid._0_4_ = 0x55b;
    txin.super_AbstractTxIn.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "SetFromHex";
    logger::info<unsigned_long&>((CfdSourceLocation *)&txin,"num_outputs={} ",(unsigned_long *)0x28)
    ;
    local_438 = 0x68;
    uVar7 = 0;
    while( true ) {
      lVar6 = lRam0000000000000020;
      if (uRam0000000000000028 <= uVar7) break;
      ConvertToByteData((ByteData *)&local_398,
                        *(uint8_t **)(lRam0000000000000020 + -0x60 + local_438),
                        *(size_t *)(lRam0000000000000020 + -0x58 + local_438));
      Script::Script(&unlocking_script,(ByteData *)&local_398);
      ConvertToByteData((ByteData *)&local_320,*(uint8_t **)(lVar6 + -0x48 + local_438),
                        *(size_t *)(lVar6 + -0x40 + local_438));
      ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)&witness_buf,(ByteData *)&local_320);
      ConvertToByteData((ByteData *)&txid_buf,*(uint8_t **)(lVar6 + -0x38 + local_438),
                        *(size_t *)(lVar6 + -0x30 + local_438));
      ConfidentialValue::ConfidentialValue(&local_2d8,(ByteData *)&txid_buf);
      ConvertToByteData((ByteData *)&script_buf,*(uint8_t **)(lVar6 + -0x28 + local_438),
                        *(size_t *)(lVar6 + -0x20 + local_438));
      ConfidentialNonce::ConfidentialNonce(&local_300,(ByteData *)&script_buf);
      ConvertToByteData((ByteData *)&blinding_buf,*(uint8_t **)(lVar6 + -0x18 + local_438),
                        *(size_t *)(lVar6 + -0x10 + local_438));
      ConvertToByteData((ByteData *)
                        &entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                        *(uint8_t **)(lVar6 + -8 + local_438),*(size_t *)(lVar6 + local_438));
      ConfidentialTxOut::ConfidentialTxOut
                ((ConfidentialTxOut *)&txin,&unlocking_script,(ConfidentialAssetId *)&witness_buf,
                 &local_2d8,&local_300,
                 (ByteData *)
                 &blinding_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                 (ByteData *)
                 &entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&entropy.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&blinding_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ConfidentialNonce::~ConfidentialNonce(&local_300);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&script_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ConfidentialValue::~ConfidentialValue(&local_2d8);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&txid_buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&witness_buf);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_320);
      Script::~Script(&unlocking_script);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_398);
      ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
      push_back(&vout_work,(value_type *)&txin);
      ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)&txin);
      uVar7 = uVar7 + 1;
      local_438 = local_438 + 0x70;
    }
    if (pvVar1 != (void *)0x0) {
      wally_tx_free(pvVar1);
      ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
      clear(&this->vin_);
      ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
      clear(&this->vout_);
    }
    ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
    operator=(&this->vin_,&vin_work);
    ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
    operator=(&this->vout_,&vout_work);
    ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
    ~vector(&vout_work);
    ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
    ~vector(&vin_work);
    return;
  }
  txin.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)0x231217;
  txin.super_AbstractTxIn.txid_._vptr_Txid._0_4_ = 0x516;
  txin.super_AbstractTxIn.txid_.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "SetFromHex";
  logger::warn<int&>((CfdSourceLocation *)&txin,"wally_tx_from_hex NG[{}] ",&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&txin,"transaction data invalid.",(allocator *)&unlocking_script);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&txin);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialTransaction::SetFromHex(const std::string &hex_string) {
  void *original_address = wally_tx_pointer_;
  std::vector<ConfidentialTxIn> vin_work;
  std::vector<ConfidentialTxOut> vout_work;

  // It is assumed that tx information has been created.
  // (If it is not created, it will cause inconsistency)
  struct wally_tx *tx_pointer = NULL;
  uint32_t flag = WALLY_TX_FLAG_USE_ELEMENTS;
  int ret = wally_tx_from_hex(hex_string.c_str(), flag, &tx_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_hex NG[{}] ", ret);
    throw CfdException(kCfdIllegalArgumentError, "transaction data invalid.");
  }
  wally_tx_pointer_ = tx_pointer;

  try {
    // create ConfidentialTxIn and ConfidentialTxOut
    for (size_t index = 0; index < tx_pointer->num_inputs; ++index) {
      struct wally_tx_input *txin_item = &tx_pointer->inputs[index];
      std::vector<uint8_t> txid_buf(
          txin_item->txhash, txin_item->txhash + sizeof(txin_item->txhash));
      std::vector<uint8_t> script_buf(
          txin_item->script, txin_item->script + txin_item->script_len);
      Script unlocking_script = Script(ByteData(script_buf));
      /* Temporarily comment out
      if (!unlocking_script.IsPushOnly()) {
        warn(CFD_LOG_SOURCE, "IsPushOnly() false.");
        throw CfdException(
            kCfdIllegalArgumentError,
            "unlocking script error. "
            "The script needs to be push operator only.");
      } */
      std::vector<uint8_t> blinding_buf(
          txin_item->blinding_nonce,
          txin_item->blinding_nonce + sizeof(txin_item->blinding_nonce));
      std::vector<uint8_t> entropy(
          txin_item->entropy, txin_item->entropy + sizeof(txin_item->entropy));
      ConfidentialTxIn txin(
          Txid(ByteData256(txid_buf)), txin_item->index, txin_item->sequence,
          unlocking_script, ScriptWitness(), ByteData256(blinding_buf),
          ByteData256(entropy),
          ConfidentialValue(ConvertToByteData(
              txin_item->issuance_amount, txin_item->issuance_amount_len)),
          ConfidentialValue(ConvertToByteData(
              txin_item->inflation_keys, txin_item->inflation_keys_len)),
          ConvertToByteData(
              txin_item->issuance_amount_rangeproof,
              txin_item->issuance_amount_rangeproof_len),
          ConvertToByteData(
              txin_item->inflation_keys_rangeproof,
              txin_item->inflation_keys_rangeproof_len),
          ScriptWitness());
      if ((txin_item->witness != NULL) &&
          (txin_item->witness->num_items != 0)) {
        struct wally_tx_witness_item *witness_stack;
        for (size_t w_index = 0; w_index < txin_item->witness->num_items;
             ++w_index) {
          witness_stack = &txin_item->witness->items[w_index];
          const std::vector<uint8_t> witness_buf(
              witness_stack->witness,
              witness_stack->witness + witness_stack->witness_len);
          txin.AddScriptWitnessStack(ByteData(witness_buf));
        }
      }
      if ((txin_item->pegin_witness != NULL) &&
          (txin_item->pegin_witness->num_items != 0)) {
        for (size_t w_index = 0; w_index < txin_item->pegin_witness->num_items;
             ++w_index) {
          struct wally_tx_witness_item *witness_stack;
          witness_stack = &txin_item->pegin_witness->items[w_index];
          const std::vector<uint8_t> witness_buf(
              witness_stack->witness,
              witness_stack->witness + witness_stack->witness_len);
          txin.AddPeginWitnessStack(ByteData(witness_buf));
        }
      }
      vin_work.push_back(txin);
    }

    info(CFD_LOG_SOURCE, "num_outputs={} ", tx_pointer->num_outputs);
    for (size_t index = 0; index < tx_pointer->num_outputs; ++index) {
      struct wally_tx_output *txout_item = &tx_pointer->outputs[index];
      ConfidentialTxOut txout(
          Script(
              ConvertToByteData(txout_item->script, txout_item->script_len)),
          ConfidentialAssetId(
              ConvertToByteData(txout_item->asset, txout_item->asset_len)),
          ConfidentialValue(
              ConvertToByteData(txout_item->value, txout_item->value_len)),
          ConfidentialNonce(
              ConvertToByteData(txout_item->nonce, txout_item->nonce_len)),
          ConvertToByteData(
              txout_item->surjectionproof, txout_item->surjectionproof_len),
          ConvertToByteData(
              txout_item->rangeproof, txout_item->rangeproof_len));
      vout_work.push_back(txout);
    }

    // If the copy process is successful, release the old buffer
    if (original_address != NULL) {
      wally_tx_free(static_cast<struct wally_tx *>(original_address));
      vin_.clear();
      vout_.clear();
    }
    vin_ = vin_work;
    vout_ = vout_work;
  } catch (const CfdException &exception) {
    // free on error
    wally_tx_free(tx_pointer);
    wally_tx_pointer_ = original_address;
    throw exception;
  } catch (...) {
    // free on error
    wally_tx_free(tx_pointer);
    wally_tx_pointer_ = original_address;
    throw CfdException(kCfdUnknownError);
  }
}